

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O2

void * __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldDefault
          (ReflectionSchema *this,FieldDescriptor *field)

{
  Message *pMVar1;
  uint32 *puVar2;
  char *pcVar3;
  int in_EDX;
  
  pMVar1 = this->default_instance_;
  puVar2 = this->offsets_;
  pcVar3 = FieldDescriptor::index(field,(char *)field,in_EDX);
  return (void *)((long)&(pMVar1->super_MessageLite)._vptr_MessageLite + (ulong)puVar2[(int)pcVar3])
  ;
}

Assistant:

const void *GetFieldDefault(const FieldDescriptor* field) const {
    return reinterpret_cast<const uint8*>(default_instance_) +
                     offsets_[field->index()];
  }